

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff_merge_replace(lyd_node *diff_match,lyd_diff_op cur_op,lyd_node *src_diff)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  lysc_node *plVar4;
  LY_ERR LVar5;
  uint uVar6;
  lys_module *plVar7;
  lyd_meta *plVar8;
  lyd_node *plVar9;
  char *__ptr;
  size_t value_len;
  lys_module *plVar10;
  char *format;
  ly_ctx *plVar11;
  undefined8 uVar12;
  char *pcVar13;
  char *local_38;
  
  plVar4 = diff_match->schema;
  if (plVar4 == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&diff_match[2].schema;
    plVar10 = (lys_module *)&diff_match[2].schema;
  }
  else {
    plVar7 = plVar4->module;
    plVar10 = plVar4->module;
  }
  plVar11 = plVar7->ctx;
  plVar7 = ly_ctx_get_module_latest(plVar10->ctx,"yang");
  if (plVar7 == (lys_module *)0x0) {
    __assert_fail("mod",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x5d5,
                  "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                 );
  }
  if (cur_op != LYD_DIFF_OP_CREATE) {
    if (cur_op != LYD_DIFF_OP_NONE) {
      if (cur_op != LYD_DIFF_OP_REPLACE) {
        __ptr = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
        pcVar13 = lyd_diff_op2str(cur_op);
        format = "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".";
        local_38 = "replace";
        goto LAB_0011a366;
      }
      goto LAB_00119f95;
    }
    uVar3 = diff_match->schema->nodetype;
    if (uVar3 == 4) {
      LVar5 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_REPLACE);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      if (src_diff == (lyd_node *)0x0) {
LAB_0011a37a:
        plVar9 = (lyd_node *)0x0;
      }
      else {
        plVar4 = src_diff->schema;
        if (plVar4 == (lysc_node *)0x0) {
          plVar9 = src_diff[1].prev;
        }
        else {
          if ((plVar4->nodetype & 0xc) == 0) goto LAB_0011a37a;
          plVar9 = *(lyd_node **)(src_diff + 1);
          if (plVar9 == (lyd_node *)0x0) {
            plVar9 = (lyd_node *)
                     lyd_value_get_canonical(plVar4->module->ctx,(lyd_value *)(src_diff + 1));
          }
        }
      }
      LVar5 = lyd_change_term(diff_match,(char *)plVar9);
      if (LVar5 == LY_SUCCESS) {
        return LY_SUCCESS;
      }
      if (src_diff->schema == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&src_diff[2].schema;
      }
      else {
        plVar7 = src_diff->schema->module;
      }
      plVar11 = plVar7->ctx;
      uVar12 = 0x639;
      goto LAB_0011a49c;
    }
    if (uVar3 != 0x10) {
      if (src_diff->schema == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&src_diff[2].schema;
      }
      else {
        plVar7 = src_diff->schema->module;
      }
      plVar11 = plVar7->ctx;
      uVar12 = 0x63d;
      goto LAB_0011a49c;
    }
    if ((diff_match->schema->flags & 0x40) == 0) {
      __assert_fail("lysc_is_userordered(diff_match->schema)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                    0x61d,
                    "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                   );
    }
    LVar5 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_REPLACE);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
    plVar4 = diff_match->schema;
    if (plVar4 == (lysc_node *)0x0) {
LAB_0011a2c0:
      local_38 = "key";
      pcVar13 = "yang:orig-key";
    }
    else {
      if (plVar4->nodetype == 8) {
        if ((plVar4->flags & 1) != 0) goto LAB_0011a2c0;
      }
      else if ((plVar4->nodetype != 0x10) || ((plVar4->flags & 0x200) == 0)) goto LAB_0011a2c0;
      local_38 = "position";
      pcVar13 = "yang:orig-position";
    }
    plVar8 = lyd_find_meta(src_diff->meta,plVar7,pcVar13 + 5);
    pcVar13 = pcVar13 + 5;
    if (plVar8 != (lyd_meta *)0x0) {
      LVar5 = lyd_dup_meta_single(plVar8,diff_match,(lyd_meta **)0x0);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      plVar8 = lyd_find_meta(src_diff->meta,plVar7,local_38);
      if (plVar8 != (lyd_meta *)0x0) {
        LVar5 = lyd_dup_meta_single(plVar8,diff_match,(lyd_meta **)0x0);
        goto joined_r0x0011a32b;
      }
      __ptr = lyd_path(src_diff,LYD_PATH_STD,(char *)0x0,0);
      format = "Failed to find metadata \"%s\" for node \"%s\".";
      pcVar13 = __ptr;
      goto LAB_0011a366;
    }
LAB_0011a339:
    local_38 = pcVar13;
    __ptr = lyd_path(src_diff,LYD_PATH_STD,(char *)0x0,0);
    format = "Failed to find metadata \"%s\" for node \"%s\".";
    pcVar13 = __ptr;
    goto LAB_0011a366;
  }
LAB_00119f95:
  uVar1 = diff_match->schema->nodetype;
  if (uVar1 < 0x10) {
    if (uVar1 == 4) {
      LVar5 = lyd_compare_single(diff_match,src_diff,0);
      if (LVar5 == LY_SUCCESS) goto LAB_0011a1d8;
      if (src_diff == (lyd_node *)0x0) {
LAB_0011a2b9:
        plVar9 = (lyd_node *)0x0;
      }
      else {
        plVar4 = src_diff->schema;
        if (plVar4 == (lysc_node *)0x0) {
          plVar9 = src_diff[1].prev;
        }
        else {
          if ((plVar4->nodetype & 0xc) == 0) goto LAB_0011a2b9;
          plVar9 = *(lyd_node **)(src_diff + 1);
          if (plVar9 == (lyd_node *)0x0) {
            plVar9 = (lyd_node *)
                     lyd_value_get_canonical(plVar4->module->ctx,(lyd_value *)(src_diff + 1));
          }
        }
      }
      LVar5 = lyd_change_term(diff_match,(char *)plVar9);
      if (LVar5 == LY_SUCCESS) {
        if (cur_op == LYD_DIFF_OP_REPLACE) {
          plVar8 = lyd_find_meta(diff_match->meta,plVar7,"orig-value");
          if (plVar8 == (lyd_meta *)0x0) {
            __ptr = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
            format = "Failed to find metadata \"%s\" for node \"%s\".";
            local_38 = "orig-value";
            pcVar13 = __ptr;
LAB_0011a366:
            ly_log(plVar11,LY_LLERR,LY_EINVAL,format,local_38,pcVar13);
            free(__ptr);
            return LY_EINVAL;
          }
          pcVar13 = (plVar8->value)._canonical;
          if (pcVar13 == (char *)0x0) {
            pcVar13 = lyd_value_get_canonical(plVar8->annotation->module->ctx,&plVar8->value);
          }
          value_len = strlen(pcVar13);
          LVar5 = lyd_value_compare((lyd_node_term *)diff_match,pcVar13,value_len);
          if (LVar5 == LY_SUCCESS) {
            lyd_free_meta_single(plVar8);
            LVar5 = lyd_diff_change_op(diff_match,LYD_DIFF_OP_NONE);
            if (LVar5 != LY_SUCCESS) {
              return LVar5;
            }
          }
        }
        uVar6 = diff_match->flags & 0xfffffffe;
        diff_match->flags = uVar6;
        diff_match->flags = src_diff->flags & 1 | uVar6;
        return LY_SUCCESS;
      }
      if (src_diff->schema == (lysc_node *)0x0) {
        plVar7 = (lys_module *)&src_diff[2].schema;
      }
      else {
        plVar7 = src_diff->schema->module;
      }
      plVar11 = plVar7->ctx;
      uVar12 = 0x5f6;
      goto LAB_0011a49c;
    }
    if (uVar1 == 8) {
LAB_00119fc3:
      if (((uVar1 & 0x18) == 0) || (uVar2 = diff_match->schema->flags, (uVar2 & 0x40) == 0)) {
        __assert_fail("lysc_is_userordered(diff_match->schema)",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                      ,0x5df,
                      "LY_ERR lyd_diff_merge_replace(struct lyd_node *, enum lyd_diff_op, const struct lyd_node *)"
                     );
      }
      pcVar13 = "position";
      if (((uVar1 == 0x10 & (byte)(uVar2 >> 9) & 1) == 0) &&
         (((uVar1 != 8 || ((uVar2 & 1) != 0)) && (pcVar13 = "value", uVar1 == 0x10)))) {
        pcVar13 = "key";
      }
      lyd_diff_del_meta(diff_match,pcVar13);
      plVar8 = lyd_find_meta(src_diff->meta,plVar7,pcVar13);
      if (plVar8 != (lyd_meta *)0x0) {
        LVar5 = lyd_dup_meta_single(plVar8,diff_match,(lyd_meta **)0x0);
joined_r0x0011a32b:
        if (LVar5 == LY_SUCCESS) {
          return LY_SUCCESS;
        }
        return LVar5;
      }
      goto LAB_0011a339;
    }
  }
  else {
    if ((uVar1 == 0x60) || (uVar1 == 0x20)) {
      LVar5 = lyd_compare_single(diff_match,src_diff,0);
      if (LVar5 != LY_SUCCESS) {
        LVar5 = lyd_any_copy_value(diff_match,(lyd_any_value *)(src_diff + 1),
                                   *(LYD_ANYDATA_VALUETYPE *)&src_diff[1].schema);
        goto joined_r0x0011a32b;
      }
LAB_0011a1d8:
      __ptr = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
      format = "Unexpected value of node \"%s\" in %s.";
      local_38 = __ptr;
      pcVar13 = "target diff";
      goto LAB_0011a366;
    }
    if (uVar1 == 0x10) goto LAB_00119fc3;
  }
  if (src_diff->schema == (lysc_node *)0x0) {
    plVar7 = (lys_module *)&src_diff[2].schema;
  }
  else {
    plVar7 = src_diff->schema->module;
  }
  plVar11 = plVar7->ctx;
  uVar12 = 0x616;
LAB_0011a49c:
  ly_log(plVar11,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",uVar12);
  return LY_EINT;
}

Assistant:

static LY_ERR
lyd_diff_merge_replace(struct lyd_node *diff_match, enum lyd_diff_op cur_op, const struct lyd_node *src_diff)
{
    LY_ERR ret;
    const char *str_val, *meta_name, *orig_meta_name;
    struct lyd_meta *meta;
    const struct lys_module *mod;
    const struct lyd_node_any *any;
    const struct ly_ctx *ctx = LYD_CTX(diff_match);

    /* get "yang" module for the metadata */
    mod = ly_ctx_get_module_latest(LYD_CTX(diff_match), "yang");
    assert(mod);

    switch (cur_op) {
    case LYD_DIFF_OP_REPLACE:
    case LYD_DIFF_OP_CREATE:
        switch (diff_match->schema->nodetype) {
        case LYS_LIST:
        case LYS_LEAFLIST:
            /* it was created/moved somewhere, but now it will be created/moved somewhere else,
             * keep orig_key/orig_value (only replace oper) and replace key/value */
            assert(lysc_is_userordered(diff_match->schema));
            if (lysc_is_dup_inst_list(diff_match->schema)) {
                meta_name = "position";
            } else if (diff_match->schema->nodetype == LYS_LIST) {
                meta_name = "key";
            } else {
                meta_name = "value";
            }

            lyd_diff_del_meta(diff_match, meta_name);
            meta = lyd_find_meta(src_diff->meta, mod, meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));
            break;
        case LYS_LEAF:
            /* replaced with the exact same value, impossible */
            if (!lyd_compare_single(diff_match, src_diff, 0)) {
                LOGERR_UNEXPVAL(ctx, diff_match, "target diff");
                return LY_EINVAL;
            }

            /* modify the node value */
            if (lyd_change_term(diff_match, lyd_get_value(src_diff))) {
                LOGINT_RET(LYD_CTX(src_diff));
            }

            if (cur_op == LYD_DIFF_OP_REPLACE) {
                /* compare values whether there is any change at all */
                meta = lyd_find_meta(diff_match->meta, mod, "orig-value");
                LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, "orig-value", diff_match), LY_EINVAL);
                str_val = lyd_get_meta_value(meta);
                ret = lyd_value_compare((struct lyd_node_term *)diff_match, str_val, strlen(str_val));
                if (!ret) {
                    /* values are the same, remove orig-value meta and set oper to NONE */
                    lyd_free_meta_single(meta);
                    LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_NONE));
                }
            }

            /* modify the default flag */
            diff_match->flags &= ~LYD_DEFAULT;
            diff_match->flags |= src_diff->flags & LYD_DEFAULT;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (!lyd_compare_single(diff_match, src_diff, 0)) {
                LOGERR_UNEXPVAL(ctx, diff_match, "target diff");
                return LY_EINVAL;
            }

            /* modify the node value */
            any = (struct lyd_node_any *)src_diff;
            LY_CHECK_RET(lyd_any_copy_value(diff_match, &any->value, any->value_type));
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        break;
    case LYD_DIFF_OP_NONE:
        switch (diff_match->schema->nodetype) {
        case LYS_LIST:
            /* it is moved now */
            assert(lysc_is_userordered(diff_match->schema));

            /* change the operation */
            LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_REPLACE));

            /* set orig-meta and meta */
            if (lysc_is_dup_inst_list(diff_match->schema)) {
                meta_name = "position";
                orig_meta_name = "orig-position";
            } else {
                meta_name = "key";
                orig_meta_name = "orig-key";
            }

            meta = lyd_find_meta(src_diff->meta, mod, orig_meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, orig_meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));

            meta = lyd_find_meta(src_diff->meta, mod, meta_name);
            LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_name, src_diff), LY_EINVAL);
            LY_CHECK_RET(lyd_dup_meta_single(meta, diff_match, NULL));
            break;
        case LYS_LEAF:
            /* only dflt flag changed, now value changed as well, update the operation */
            LY_CHECK_RET(lyd_diff_change_op(diff_match, LYD_DIFF_OP_REPLACE));

            /* modify the node value */
            if (lyd_change_term(diff_match, lyd_get_value(src_diff))) {
                LOGINT_RET(LYD_CTX(src_diff));
            }
            break;
        default:
            LOGINT_RET(LYD_CTX(src_diff));
        }
        break;
    default:
        /* delete operation is not valid */
        LOGERR_MERGEOP(ctx, diff_match, cur_op, LYD_DIFF_OP_REPLACE);
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}